

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

void print_utf16(unsigned_long val)

{
  bool bVar1;
  ostream *poVar2;
  unsigned_long in_RDX;
  int in_R8D;
  string local_a0;
  byte *local_80;
  char *ch;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  undefined1 local_30 [8];
  string result;
  unsigned_long val_local;
  
  result.field_2._8_8_ = val;
  QUtil::toUTF16_abi_cxx11_((string *)local_30,(QUtil *)val,in_RDX);
  poVar2 = std::operator<<((ostream *)&std::cout,"0x");
  QUtil::uint_to_string_base_abi_cxx11_
            ((string *)&__range1,(QUtil *)result.field_2._8_8_,0x10,0,in_R8D);
  poVar2 = std::operator<<(poVar2,(string *)&__range1);
  std::operator<<(poVar2," ->");
  std::__cxx11::string::~string((string *)&__range1);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  ch = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&ch);
    if (!bVar1) break;
    local_80 = (byte *)__gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&__end1);
    poVar2 = std::operator<<((ostream *)&std::cout," ");
    QUtil::int_to_string_base_abi_cxx11_(&local_a0,(QUtil *)(ulong)*local_80,0x10,2,in_R8D);
    std::operator<<(poVar2,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

static void
print_utf16(unsigned long val)
{
    std::string result = QUtil::toUTF16(val);
    std::cout << "0x" << QUtil::uint_to_string_base(val, 16) << " ->";
    for (auto const& ch: result) {
        std::cout << " "
                  << QUtil::int_to_string_base(
                         static_cast<int>(static_cast<unsigned char>(ch)), 16, 2);
    }
    std::cout << std::endl;
}